

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::SupportVectorClassifier::MergePartialFromCodedStream
          (SupportVectorClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  Kernel *this_00;
  ulong extraout_RAX;
  Int64Vector *this_01;
  ulong extraout_RAX_00;
  StringVector *this_02;
  ulong extraout_RAX_01;
  Type *this_03;
  SparseSupportVectors *this_04;
  ulong extraout_RAX_02;
  DenseSupportVectors *this_05;
  ulong extraout_RAX_03;
  pair<int,_int> pVar7;
  RepeatedField<double> *pRVar8;
  char cVar9;
  uint uVar10;
  int byte_limit;
  ulong uVar11;
  int iVar12;
  int local_84;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar10, (~(uint)*pbVar1 & uVar10) < 0x80))
        goto LAB_00257ed8;
        uVar11 = (ulong)((uVar10 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_00257ed8:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar6 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_00257b5b;
    uVar10 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar11;
    switch(uVar10) {
    case 1:
      if (cVar9 != '\n') goto LAB_00257b5b;
      if (this->kernel_ == (Kernel *)0x0) {
        this_00 = (Kernel *)operator_new(0x20);
        Kernel::Kernel(this_00);
        this->kernel_ = this_00;
      }
      MergePartialFromCodedStream();
      uVar11 = extraout_RAX;
      break;
    case 2:
      if (cVar9 == '\x10') {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,0x12,input,&this->numberofsupportvectorsperclass_);
      }
      else {
        if ((uVar6 & 0xff) != 0x12) goto LAB_00257b5b;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&this->numberofsupportvectorsperclass_);
      }
      goto LAB_00257b7d;
    case 3:
      if (cVar9 != '\x1a') goto LAB_00257b5b;
      if (this->_oneof_case_[0] != 3) {
        clear_supportVectors(this);
        this->_oneof_case_[0] = 3;
        this_04 = (SparseSupportVectors *)operator_new(0x30);
        SparseSupportVectors::SparseSupportVectors(this_04);
        (this->supportVectors_).sparsesupportvectors_ = this_04;
      }
      MergePartialFromCodedStream();
      uVar11 = extraout_RAX_02;
      break;
    case 4:
      if (cVar9 != '\"') goto LAB_00257b5b;
      if (this->_oneof_case_[0] != 4) {
        clear_supportVectors(this);
        this->_oneof_case_[0] = 4;
        this_05 = (DenseSupportVectors *)operator_new(0x30);
        DenseSupportVectors::DenseSupportVectors(this_05);
        (this->supportVectors_).densesupportvectors_ = this_05;
      }
      MergePartialFromCodedStream();
      uVar11 = extraout_RAX_03;
      break;
    case 5:
      if (cVar9 != '*') goto LAB_00257b5b;
      this_03 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
                          (&(this->coefficients_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
        bVar5 = true;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar5 = -1 < byte_limit;
      }
      iVar12 = 6;
      if ((((bVar5) &&
           (pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,byte_limit), -1 < (long)pVar7)) &&
          (bVar5 = Coefficients::MergePartialFromCodedStream(this_03,input), bVar5)) &&
         (bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar7.first), bVar5)) goto LAB_00257b85;
      goto LAB_00257b88;
    case 6:
      if (cVar9 == '1') {
        uVar6 = 0x32;
        pRVar8 = &this->rho_;
LAB_00257e95:
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (1,uVar6,input,pRVar8);
      }
      else {
        pRVar8 = &this->rho_;
        if ((uVar6 & 0xff) != 0x32) goto LAB_00257b5b;
LAB_00257e35:
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,pRVar8);
      }
LAB_00257b7d:
      if (bVar5 != false) goto LAB_00257b85;
      iVar12 = 6;
      goto LAB_00257b88;
    case 7:
      if (cVar9 == '9') {
        uVar6 = 0x3a;
        pRVar8 = &this->proba_;
        goto LAB_00257e95;
      }
      pRVar8 = &this->proba_;
      if ((uVar6 & 0xff) == 0x3a) goto LAB_00257e35;
      goto LAB_00257b5b;
    case 8:
      if (cVar9 == 'A') {
        uVar6 = 0x42;
        pRVar8 = &this->probb_;
        goto LAB_00257e95;
      }
      pRVar8 = &this->probb_;
      if ((uVar6 & 0xff) == 0x42) goto LAB_00257e35;
LAB_00257b5b:
      iVar12 = 7;
      if ((uVar6 & 7) != 4 && uVar6 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
        goto LAB_00257b7d;
      }
      goto LAB_00257b88;
    default:
      if (uVar10 == 100) {
        if (cVar9 != '\"') goto LAB_00257b5b;
        if (this->_oneof_case_[1] != 100) {
          clear_ClassLabels(this);
          this->_oneof_case_[1] = 100;
          this_02 = (StringVector *)operator_new(0x30);
          StringVector::StringVector(this_02);
          (this->ClassLabels_).stringclasslabels_ = this_02;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_01;
      }
      else {
        if ((uVar10 != 0x65) || (cVar9 != '*')) goto LAB_00257b5b;
        if (this->_oneof_case_[1] != 0x65) {
          clear_ClassLabels(this);
          this->_oneof_case_[1] = 0x65;
          this_01 = (Int64Vector *)operator_new(0x28);
          Int64Vector::Int64Vector(this_01);
          (this->ClassLabels_).int64classlabels_ = this_01;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_00;
      }
    }
    iVar12 = local_84;
    if ((uVar11 & 1) == 0) {
LAB_00257b85:
      iVar12 = 0;
    }
LAB_00257b88:
    if (iVar12 != 0) {
      return iVar12 != 6;
    }
  } while( true );
}

Assistant:

bool SupportVectorClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SupportVectorClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Kernel kernel = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_kernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 numberOfSupportVectorsPerClass = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_numberofsupportvectorsperclass())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(16u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 18u, input, this->mutable_numberofsupportvectorsperclass())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sparsesupportvectors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_densesupportvectors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.Coefficients coefficients = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_coefficients()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double rho = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_rho())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(49u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 50u, input, this->mutable_rho())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double probA = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_proba())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(57u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 58u, input, this->mutable_proba())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double probB = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_probb())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(65u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 66u, input, this->mutable_probb())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SupportVectorClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SupportVectorClassifier)
  return false;
#undef DO_
}